

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O0

void __thiscall nivalis::anon_unknown_3::Differentiator::end_thunk(Differentiator *this)

{
  _OpCode *__args;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_RDI;
  pointer this_00;
  
  this_00 = in_RDI[0xb].
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  __args = (_OpCode *)
           std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size
                     ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                      in_RDI[0xb].
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>::
  emplace_back<nivalis::OpCode::_OpCode,unsigned_long>(in_RDI,__args,(unsigned_long *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x15085e);
  return;
}

Assistant:

void end_thunk() {
        out.emplace_back(OpCode::thunk_jmp,
                    out.size() - thunks.back());
        thunks.pop_back();
    }